

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O1

VersionBitsTester * __thiscall
VersionBitsTester::TestState(VersionBitsTester *this,ThresholdState exp,ThresholdState exp_delayed)

{
  pointer ppCVar1;
  ThresholdState state;
  ThresholdState state_00;
  ThresholdState state_01;
  ThresholdState state_02;
  int iVar2;
  uint64_t uVar3;
  long lVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  int bits;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar8;
  int *args_3;
  CBlockIndex *local_210;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  assertion_result local_150;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  undefined4 local_f4;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  ThresholdState exp_delayed_local;
  ThresholdState exp_local;
  undefined4 *local_c8;
  int height;
  undefined4 uStack_bc;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  string *local_a0;
  string local_98;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  exp_delayed_local = exp_delayed;
  exp_local = exp;
  if (exp != exp_delayed) {
    local_e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
    ;
    local_d8 = "";
    local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x9a;
    file.m_begin = (iterator)&local_e0;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
    local_78[8] = false;
    local_78._0_8_ = &PTR__lazy_ostream_013abb30;
    local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_68._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_c8 = &local_f4;
    local_f4 = 3;
    _height = (pointer)&exp_local;
    local_98._M_dataplus._M_p._0_1_ = exp_local == ACTIVE;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    local_150._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
    ;
    local_150.m_message.px = (element_type *)0xf7a1ec;
    local_a0 = (string *)&height;
    local_b8[8] = '\0';
    local_b8._0_8_ = &PTR__lazy_ostream_013b1d70;
    local_a8 = boost::unit_test::lazy_ostream::inst;
    local_48._8_8_ = &local_c8;
    local_58[8] = 0;
    local_58._0_8_ = &PTR__lazy_ostream_013b1d70;
    local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    pvVar5 = (iterator)0x1;
    pvVar6 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_98,(lazy_ostream *)local_78,1,2,REQUIRE,0xe7e153,
               (size_t)&local_150,0x9a,local_b8,"ThresholdState::ACTIVE",local_58);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_98.field_2._M_allocated_capacity);
    local_108 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
    ;
    local_100 = "";
    local_118 = &boost::unit_test::basic_cstring<char_const>::null;
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x9b;
    file_00.m_begin = (iterator)&local_108;
    msg_00.m_end = pvVar6;
    msg_00.m_begin = pvVar5;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_118,
               msg_00);
    local_78[8] = false;
    local_78._0_8_ = &PTR__lazy_ostream_013abb30;
    _height = (pointer)&exp_delayed_local;
    local_98._M_dataplus._M_p._0_1_ = exp_delayed_local == LOCKED_IN;
    local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_68._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_f4 = 2;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    local_150._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
    ;
    local_150.m_message.px = (element_type *)0xf7a1ec;
    local_b8[8] = '\0';
    local_b8._0_8_ = &PTR__lazy_ostream_013b1d70;
    local_a8 = boost::unit_test::lazy_ostream::inst;
    local_a0 = (string *)&height;
    local_c8 = &local_f4;
    local_58[8] = 0;
    local_58._0_8_ = &PTR__lazy_ostream_013b1d70;
    local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_48._8_8_ = &local_c8;
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_98,(lazy_ostream *)local_78,1,2,REQUIRE,0xf7a2a4,
               (size_t)&local_150,0x9b,local_b8,"ThresholdState::LOCKED_IN",local_58);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_98.field_2._M_allocated_capacity);
  }
  ppCVar1 = (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
      super__Vector_impl_data._M_start == ppCVar1) {
    local_210 = (CBlockIndex *)0x0;
  }
  else {
    local_210 = ppCVar1[-1];
  }
  args_3 = &this->num;
  lVar4 = 0;
  bits = 0;
  do {
    uVar3 = RandomMixin<FastRandomContext>::randbits
                      (&this->m_rng->super_RandomMixin<FastRandomContext>,bits);
    if (uVar3 == 0) {
      state = AbstractThresholdConditionChecker::GetStateFor
                        ((AbstractThresholdConditionChecker *)
                         ((long)&this->checker[0].super_AbstractThresholdConditionChecker.
                                 _vptr_AbstractThresholdConditionChecker + lVar4),local_210,
                         &paramsDummy,
                         (ThresholdConditionCache *)
                         (&this->checker[0].cache._M_t._M_impl.field_0x0 + lVar4));
      state_00 = AbstractThresholdConditionChecker::GetStateFor
                           ((AbstractThresholdConditionChecker *)
                            ((long)&this->checker_delayed[0].super_TestConditionChecker.
                                    super_AbstractThresholdConditionChecker.
                                    _vptr_AbstractThresholdConditionChecker + lVar4),local_210,
                            &paramsDummy,
                            (ThresholdConditionCache *)
                            (&this->checker_delayed[0].super_TestConditionChecker.cache._M_t._M_impl
                              .field_0x0 + lVar4));
      state_01 = AbstractThresholdConditionChecker::GetStateFor
                           ((AbstractThresholdConditionChecker *)
                            ((long)&this->checker_always[0].super_TestConditionChecker.
                                    super_AbstractThresholdConditionChecker.
                                    _vptr_AbstractThresholdConditionChecker + lVar4),local_210,
                            &paramsDummy,
                            (ThresholdConditionCache *)
                            (&this->checker_always[0].super_TestConditionChecker.cache._M_t._M_impl.
                              field_0x0 + lVar4));
      state_02 = AbstractThresholdConditionChecker::GetStateFor
                           ((AbstractThresholdConditionChecker *)
                            ((long)&this->checker_never[0].super_TestConditionChecker.
                                    super_AbstractThresholdConditionChecker.
                                    _vptr_AbstractThresholdConditionChecker + lVar4),local_210,
                            &paramsDummy,
                            (ThresholdConditionCache *)
                            (&this->checker_never[0].super_TestConditionChecker.cache._M_t._M_impl.
                              field_0x0 + lVar4));
      if (local_210 == (CBlockIndex *)0x0) {
        iVar2 = 0;
      }
      else {
        iVar2 = local_210->nHeight + 1;
      }
      height = iVar2;
      local_128 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_120 = "";
      local_138 = &boost::unit_test::basic_cstring<char_const>::null;
      local_130 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0xa8;
      file_01.m_begin = (iterator)&local_128;
      msg_01.m_end = in_R9;
      msg_01.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_138,
                 msg_01);
      local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)(state == exp_local);
      local_150.m_message.px = (element_type *)0x0;
      local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
      StateName_abi_cxx11_((string *)local_78,exp_local);
      StateName_abi_cxx11_(&local_98,state);
      _cVar8 = 0x7993dd;
      tinyformat::format<int,std::__cxx11::string,int,std::__cxx11::string>
                ((string *)local_58,(tinyformat *)"Test %i for %s height %d (got %s)",(char *)args_3
                 ,(int *)local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&height,
                 (int *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_3);
      local_b8[8] = '\0';
      local_b8._0_8_ = &PTR__lazy_ostream_013aba30;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      local_160 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_158 = "";
      pvVar5 = (iterator)0x1;
      pvVar6 = (iterator)0x1;
      local_a0 = (string *)local_58;
      boost::test_tools::tt_detail::report_assertion
                (&local_150,(lazy_ostream *)local_b8,1,1,WARN,_cVar8,(size_t)&local_160,0xa8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &local_48) {
        operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_) !=
          &local_98.field_2) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_)
                        ,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._0_8_ != &local_68) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
      }
      boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
      local_170 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_168 = "";
      local_180 = &boost::unit_test::basic_cstring<char_const>::null;
      local_178 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0xa9;
      file_02.m_begin = (iterator)&local_170;
      msg_02.m_end = pvVar6;
      msg_02.m_begin = pvVar5;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_180,
                 msg_02);
      local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)(state_00 == exp_delayed_local);
      local_150.m_message.px = (element_type *)0x0;
      local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
      StateName_abi_cxx11_((string *)local_78,exp_delayed_local);
      StateName_abi_cxx11_(&local_98,state_00);
      _cVar8 = 0x79959a;
      tinyformat::format<int,std::__cxx11::string,int,std::__cxx11::string>
                ((string *)local_58,(tinyformat *)"Test %i for %s height %d (got %s; delayed case)",
                 (char *)args_3,(int *)local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&height,
                 (int *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_3);
      local_b8[8] = '\0';
      local_b8._0_8_ = &PTR__lazy_ostream_013aba30;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      local_190 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_188 = "";
      pvVar5 = (iterator)0x1;
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      local_a0 = (string *)local_58;
      boost::test_tools::tt_detail::report_assertion
                (&local_150,(lazy_ostream *)local_b8,1,1,WARN,_cVar8,(size_t)&local_190,0xa9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &local_48) {
        operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_) !=
          &local_98.field_2) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_)
                        ,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._0_8_ != &local_68) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
      }
      boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
      local_1a0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_198 = "";
      local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0xaa;
      file_03.m_begin = (iterator)&local_1a0;
      msg_03.m_end = (iterator)pbVar7;
      msg_03.m_begin = pvVar5;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1b0,
                 msg_03);
      local_98._M_dataplus._M_p._0_1_ = state_01 == ACTIVE;
      local_98._M_string_length = 0;
      local_98.field_2._M_allocated_capacity = 0;
      StateName_abi_cxx11_((string *)local_78,state_01);
      _cVar8 = 0x799729;
      tinyformat::format<int,int,std::__cxx11::string>
                ((string *)local_58,
                 (tinyformat *)"Test %i for ACTIVE height %d (got %s; always active case)",
                 (char *)args_3,&height,(int *)local_78,pbVar7);
      local_b8[8] = '\0';
      local_b8._0_8_ = &PTR__lazy_ostream_013aba30;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      local_1c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_1b8 = "";
      pvVar5 = (iterator)0x1;
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      local_a0 = (string *)local_58;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_98,(lazy_ostream *)local_b8,1,1,WARN,_cVar8,
                 (size_t)&local_1c0,0xaa);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &local_48) {
        operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._0_8_ != &local_68) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
      }
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_98.field_2._M_allocated_capacity);
      local_1d0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_1c8 = "";
      local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0xab;
      file_04.m_begin = (iterator)&local_1d0;
      msg_04.m_end = (iterator)pbVar7;
      msg_04.m_begin = pvVar5;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1e0,
                 msg_04);
      local_98._M_dataplus._M_p._0_1_ = state_02 == FAILED;
      local_98._M_string_length = 0;
      local_98.field_2._M_allocated_capacity = 0;
      StateName_abi_cxx11_((string *)local_78,state_02);
      _cVar8 = 0x799887;
      tinyformat::format<int,int,std::__cxx11::string>
                ((string *)local_58,
                 (tinyformat *)"Test %i for FAILED height %d (got %s; never active case)",
                 (char *)args_3,&height,(int *)local_78,pbVar7);
      local_b8[8] = '\0';
      local_b8._0_8_ = &PTR__lazy_ostream_013aba30;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      local_1f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_1e8 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x1;
      local_a0 = (string *)local_58;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_98,(lazy_ostream *)local_b8,1,1,WARN,_cVar8,
                 (size_t)&local_1f0,0xab);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &local_48) {
        operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._0_8_ != &local_68) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
      }
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_98.field_2._M_allocated_capacity);
    }
    bits = bits + 1;
    lVar4 = lVar4 + 0x38;
  } while (lVar4 != 0x150);
  this->num = this->num + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

VersionBitsTester& TestState(ThresholdState exp, ThresholdState exp_delayed)
    {
        if (exp != exp_delayed) {
            // only expected differences are that delayed stays in locked_in longer
            BOOST_CHECK_EQUAL(exp, ThresholdState::ACTIVE);
            BOOST_CHECK_EQUAL(exp_delayed, ThresholdState::LOCKED_IN);
        }

        const CBlockIndex* pindex = Tip();
        for (int i = 0; i < CHECKERS; i++) {
            if (m_rng.randbits(i) == 0) {
                ThresholdState got = checker[i].GetStateFor(pindex);
                ThresholdState got_delayed = checker_delayed[i].GetStateFor(pindex);
                ThresholdState got_always = checker_always[i].GetStateFor(pindex);
                ThresholdState got_never = checker_never[i].GetStateFor(pindex);
                // nHeight of the next block. If vpblock is empty, the next (ie first)
                // block should be the genesis block with nHeight == 0.
                int height = pindex == nullptr ? 0 : pindex->nHeight + 1;
                BOOST_CHECK_MESSAGE(got == exp, strprintf("Test %i for %s height %d (got %s)", num, StateName(exp), height, StateName(got)));
                BOOST_CHECK_MESSAGE(got_delayed == exp_delayed, strprintf("Test %i for %s height %d (got %s; delayed case)", num, StateName(exp_delayed), height, StateName(got_delayed)));
                BOOST_CHECK_MESSAGE(got_always == ThresholdState::ACTIVE, strprintf("Test %i for ACTIVE height %d (got %s; always active case)", num, height, StateName(got_always)));
                BOOST_CHECK_MESSAGE(got_never == ThresholdState::FAILED, strprintf("Test %i for FAILED height %d (got %s; never active case)", num, height, StateName(got_never)));
            }
        }
        num++;
        return *this;
    }